

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 prune_lowcnt(dtree_node_t *node,float32 cnt_thr)

{
  uint32 uVar1;
  uint32 uVar2;
  float32 cnt_thr_local;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_local._4_4_ = 0;
  }
  else if (((float)node->y->occ < (float)cnt_thr) || ((float)node->n->occ < (float)cnt_thr)) {
    node_local._4_4_ = prune_subtrees(node);
  }
  else {
    uVar1 = prune_lowcnt(node->y,cnt_thr);
    uVar2 = prune_lowcnt(node->n,cnt_thr);
    node_local._4_4_ = uVar1 + uVar2;
  }
  return node_local._4_4_;
}

Assistant:

uint32
prune_lowcnt(dtree_node_t *node, float32 cnt_thr)
{
    if (!IS_LEAF(node)) {
	/* Not a leaf node */
	if ((node->y->occ < cnt_thr) ||
	    (node->n->occ < cnt_thr)) {
	    return prune_subtrees(node);
	}
	else {
	    return
		prune_lowcnt(node->y, cnt_thr) + prune_lowcnt(node->n, cnt_thr);
	}
    }
    else {
	return 0;
    }
}